

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O2

trie_node trie_node_insert(trie t,trie_node parent,trie_key key,trie_value value)

{
  trie_node_free_conflict __ptr;
  ulong uVar1;
  int iVar2;
  undefined8 *__ptr_00;
  set psVar3;
  trie_node ptVar4;
  ulong uVar5;
  ulong uVar6;
  trie_node ptVar7;
  size_t sVar8;
  char *pcVar9;
  
  if (key == (trie_key)0x0) {
    pcVar9 = "Trie invalid node insertion parameters";
    sVar8 = 0xe3;
LAB_00117f30:
    log_write_impl_va("metacall",sVar8,"trie_node_insert",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                      ,LOG_LEVEL_ERROR,pcVar9);
    return (trie_node)0x0;
  }
  __ptr_00 = (undefined8 *)malloc(0x10);
  if (__ptr_00 == (undefined8 *)0x0) {
    pcVar9 = "Trie node insert bad reference node allocation";
    sVar8 = 0xec;
    goto LAB_00117f30;
  }
  *__ptr_00 = key;
  if (parent->childs == (set)0x0) {
    psVar3 = set_create(t->hash_cb,t->compare_cb);
    parent->childs = psVar3;
    if (psVar3 == (set)0x0) {
      pcVar9 = "Trie invalid child set allocation";
      sVar8 = 0xf9;
      goto LAB_00118027;
    }
  }
  __ptr = t->free_node_list;
  if (__ptr == (trie_node_free_conflict)0x0) {
    ptVar4 = t->node_list;
    uVar5 = t->size;
    uVar6 = uVar5 + 1;
    uVar1 = t->capacity;
    if (uVar1 <= uVar6) {
      ptVar4 = (trie_node)realloc(ptVar4,uVar1 * 0x50);
      if (ptVar4 == (trie_node)0x0) {
        pcVar9 = "Trie bad node list reallocation";
        sVar8 = 0x11d;
        goto LAB_00118027;
      }
      t->node_list = ptVar4;
      t->capacity = uVar1 * 2;
      t->root = ptVar4;
      uVar5 = t->size;
      ptVar7 = ptVar4 + uVar5;
      uVar6 = uVar5;
      while( true ) {
        uVar6 = uVar6 + 1;
        if (uVar1 * 2 <= uVar6) break;
        ptVar7[1].childs = (set)0x0;
        ptVar7[1].key = (trie_key)0x0;
        ptVar7[1].value = (trie_value)0x0;
        ptVar7[1].parent_index = 0;
        ptVar7[1].self_index = 0;
        ptVar7 = ptVar7 + 1;
      }
      uVar6 = uVar5 + 1;
    }
    __ptr_00[1] = uVar5;
    ptVar4 = ptVar4 + uVar5;
    t->size = uVar6;
  }
  else {
    t->free_node_list = __ptr->next;
    sVar8 = __ptr->index;
    __ptr_00[1] = sVar8;
    ptVar4 = t->node_list + sVar8;
    free(__ptr);
    t->size = t->size + 1;
  }
  if (ptVar4 == (trie_node)0x0) {
    free(__ptr_00);
    return (trie_node)0x0;
  }
  iVar2 = set_insert(parent->childs,key,__ptr_00);
  if (iVar2 == 0) {
    ptVar4->parent_index = parent->self_index;
    ptVar4->self_index = __ptr_00[1];
    ptVar4->key = key;
    ptVar4->value = value;
    ptVar4->childs = (set)0x0;
    return ptVar4;
  }
  pcVar9 = "Trie invalid child insertion";
  sVar8 = 0x141;
LAB_00118027:
  log_write_impl_va("metacall",sVar8,"trie_node_insert",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                    ,LOG_LEVEL_ERROR,pcVar9);
  free(__ptr_00);
  return (trie_node)0x0;
}

Assistant:

trie_node trie_node_insert(trie t, trie_node parent, trie_key key, trie_value value)
{
	trie_node child;
	trie_node_ref child_ref;

	if (t == NULL || parent == NULL || key == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Trie invalid node insertion parameters");

		return NULL;
	}

	child_ref = malloc(sizeof(struct trie_node_ref_type));

	if (child_ref == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Trie node insert bad reference node allocation");

		return NULL;
	}

	child_ref->key = key;

	if (parent->childs == NULL)
	{
		parent->childs = set_create(t->hash_cb, t->compare_cb);

		if (parent->childs == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Trie invalid child set allocation");

			free(child_ref);

			return NULL;
		}
	}

	if (t->free_node_list != NULL)
	{
		trie_node_free node_free = t->free_node_list;

		t->free_node_list = node_free->next;

		child_ref->index = node_free->index;

		child = &t->node_list[child_ref->index];

		free(node_free);

		++t->size;
	}
	else
	{
		if ((t->size + 1) >= t->capacity)
		{
			register void *node_list;

			size_t capacity = t->capacity << 1;

			size_t iterator;

			node_list = realloc(t->node_list, capacity * sizeof(struct trie_node_type));

			if (node_list == NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Trie bad node list reallocation");

				free(child_ref);

				return NULL;
			}

			t->node_list = node_list;

			t->capacity = capacity;

			t->root = &t->node_list[0];

			for (iterator = t->size + 1; iterator < t->capacity; ++iterator)
			{
				trie_node n = &t->node_list[iterator];

				n->parent_index = 0;
				n->self_index = 0;
				n->key = NULL;
				n->value = NULL;
				n->childs = NULL;
			}
		}

		child_ref->index = t->size;

		child = &t->node_list[child_ref->index];

		++t->size;
	}

	if (child != NULL)
	{
		if (set_insert(parent->childs, key, child_ref) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Trie invalid child insertion");

			free(child_ref);

			return NULL;
		}

		child->parent_index = parent->self_index;
		child->self_index = child_ref->index;
		child->key = key;
		child->value = value;
		child->childs = NULL;

		return child;
	}

	free(child_ref);

	return NULL;
}